

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::OpenPopupOnItemClick(char *str_id,ImGuiPopupFlags popup_flags)

{
  ImGuiWindow *this;
  bool bVar1;
  ImGuiID id;
  
  this = GImGui->CurrentWindow;
  bVar1 = IsMouseReleased(popup_flags & 0x1f);
  if (bVar1) {
    bVar1 = IsItemHovered(8);
    if (bVar1) {
      if (str_id == (char *)0x0) {
        id = (this->DC).LastItemId;
      }
      else {
        id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
      }
      if (id != 0) {
        OpenPopupEx(id,popup_flags);
        return;
      }
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x20c8,"void ImGui::OpenPopupOnItemClick(const char *, ImGuiPopupFlags)");
    }
  }
  return;
}

Assistant:

void ImGui::OpenPopupOnItemClick(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
    {
        ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
        IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
        OpenPopupEx(id, popup_flags);
    }
}